

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_comparison_unit.c
# Opt level: O1

void generic_subset_test(uint8_t type1,uint8_t type2)

{
  _Bool _Var1;
  array_container_t *c1;
  array_container_t *c2;
  int i;
  int iVar2;
  uint uVar3;
  undefined7 in_register_00000039;
  
  iVar2 = (int)CONCAT71(in_register_00000039,type1);
  if (iVar2 == 3) {
    c1 = (array_container_t *)run_container_create();
  }
  else if (iVar2 == 2) {
    c1 = array_container_create();
  }
  else {
    c1 = (array_container_t *)bitset_container_create();
  }
  _assert_true((unsigned_long)c1,"result",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/container_comparison_unit.c"
               ,0x43);
  if (type2 == '\x03') {
    c2 = (array_container_t *)run_container_create();
  }
  else if (type2 == '\x02') {
    c2 = array_container_create();
  }
  else {
    c2 = (array_container_t *)bitset_container_create();
  }
  _assert_true((unsigned_long)c2,"result",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/container_comparison_unit.c"
               ,0x43);
  _Var1 = container_is_subset(c1,type1,c2,type2);
  _assert_true((ulong)_Var1,"container_is_subset(container1, type1, container2, type2)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/container_comparison_unit.c"
               ,0xa4);
  iVar2 = 0;
  do {
    container_checked_add(c1,(uint16_t)iVar2,type1);
    container_checked_add(c2,(uint16_t)iVar2,type2);
    _Var1 = container_is_subset(c1,type1,c2,type2);
    _assert_true((ulong)_Var1,"container_is_subset(container1, type1, container2, type2)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/container_comparison_unit.c"
                 ,0xa8);
    iVar2 = iVar2 + 0xb;
  } while (iVar2 != 0x44c);
  iVar2 = 0;
  do {
    container_checked_add(c2,(uint16_t)iVar2,type2);
    _Var1 = container_is_subset(c1,type1,c2,type2);
    _assert_true((ulong)_Var1,"container_is_subset(container1, type1, container2, type2)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/container_comparison_unit.c"
                 ,0xac);
    iVar2 = iVar2 + 7;
  } while (iVar2 != 700);
  iVar2 = 0;
  uVar3 = 0;
  do {
    if (((uVar3 / 7) * 0x23 != iVar2) && ((uVar3 / 0xb) * 0x37 != iVar2)) {
      container_checked_add(c1,(uint16_t)iVar2,type1);
      _Var1 = container_is_subset(c1,type1,c2,type2);
      _assert_true((ulong)!_Var1,"container_is_subset(container1, type1, container2, type2)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/container_comparison_unit.c"
                   ,0xb1);
      container_checked_add(c2,(uint16_t)iVar2,type2);
      _Var1 = container_is_subset(c1,type1,c2,type2);
      _assert_true((ulong)_Var1,"container_is_subset(container1, type1, container2, type2)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/container_comparison_unit.c"
                   ,0xb3);
    }
    uVar3 = uVar3 + 1;
    iVar2 = iVar2 + 5;
  } while (iVar2 != 500);
  container_free(c1,type1);
  container_free(c2,type2);
  return;
}

Assistant:

void generic_subset_test(uint8_t type1, uint8_t type2) {
    container_t *container1 = container_create(type1);
    container_t *container2 = container_create(type2);
    assert_true(container_is_subset(container1, type1, container2, type2));
    for (int i = 0; i < 100; i++) {
        container_checked_add(container1, i * 11, type1);
        container_checked_add(container2, i * 11, type2);
        assert_true(container_is_subset(container1, type1, container2, type2));
    }
    for (int i = 0; i < 100; i++) {
        container_checked_add(container2, i * 7, type2);
        assert_true(container_is_subset(container1, type1, container2, type2));
    }
    for (int i = 0; i < 100; i++) {
        if (i % 7 == 0 || i % 11 == 0) continue;
        container_checked_add(container1, i * 5, type1);
        assert_false(container_is_subset(container1, type1, container2, type2));
        container_checked_add(container2, i * 5, type2);
        assert_true(container_is_subset(container1, type1, container2, type2));
    }
    container_free(container1, type1);
    container_free(container2, type2);
}